

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall Centaurus::Grammar<wchar_t>::Grammar(Grammar<wchar_t> *this,char *path)

{
  char *path_local;
  Grammar<wchar_t> *this_local;
  
  IGrammar::IGrammar(&this->super_IGrammar);
  (this->super_IGrammar)._vptr_IGrammar = (_func_int **)&PTR__Grammar_003133a8;
  std::
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
  ::unordered_map(&this->m_networks);
  std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::vector
            (&this->m_identifiers);
  Identifier::Identifier(&this->m_root_id);
  Identifier::Identifier(&this->m_grammar_name);
  GrammarOptions::GrammarOptions(&this->m_options);
  parse(this,path,1);
  (*(this->super_IGrammar)._vptr_IGrammar[8])();
  return;
}

Assistant:

Grammar(const char *path)
    {
        parse(path);

        optimize();
    }